

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qprintsettingsoutput.h
# Opt level: O0

void __thiscall
Ui_QPrintSettingsOutput::retranslateUi(Ui_QPrintSettingsOutput *this,QWidget *QPrintSettingsOutput)

{
  QString *pQVar1;
  QWidget *pQVar2;
  uint uVar3;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char local_230 [24];
  char local_218 [24];
  char local_200 [24];
  char local_1e8 [24];
  char local_1d0 [24];
  char local_1b8 [24];
  char local_1a0 [24];
  char local_188 [24];
  char local_170 [24];
  char local_158 [24];
  char local_140 [24];
  char local_128 [24];
  char local_110 [24];
  char local_f8 [24];
  char local_e0 [24];
  char local_c8 [24];
  char local_b0 [24];
  char local_98 [24];
  char local_80 [24];
  char local_68 [24];
  char local_50 [24];
  char local_38 [24];
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::translate(local_20,"QPrintSettingsOutput","Form",0);
  QWidget::setWindowTitle(in_RSI);
  QString::~QString((QString *)0x179314);
  pQVar1 = *(QString **)(in_RDI + 0x20);
  QCoreApplication::translate(local_38,"QPrintSettingsOutput","Print range",0);
  QGroupBox::setTitle(pQVar1);
  QString::~QString((QString *)0x17936f);
  pQVar1 = *(QString **)(in_RDI + 0x30);
  QCoreApplication::translate(local_50,"QPrintSettingsOutput","Print all",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x1793ca);
  pQVar1 = *(QString **)(in_RDI + 0x40);
  QCoreApplication::translate(local_68,"QPrintSettingsOutput","Pages from",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x179425);
  pQVar1 = *(QString **)(in_RDI + 0x50);
  QCoreApplication::translate(local_80,"QPrintSettingsOutput","to",0);
  QLabel::setText(pQVar1);
  QString::~QString((QString *)0x179480);
  pQVar1 = *(QString **)(in_RDI + 0x70);
  QCoreApplication::translate(local_98,"QPrintSettingsOutput","Pages",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x1794db);
  pQVar1 = *(QString **)(in_RDI + 0x78);
  QCoreApplication::translate
            (local_b0,"QPrintSettingsOutput",
             "Specify pages or ranges separated by commas. Ranges are specified by two numbers separated by a hyphen. E.g: 3,5-7,9 prints pages 3, 5, 6, 7 and 9."
             ,0);
  QWidget::setToolTip(pQVar1);
  QString::~QString((QString *)0x179536);
  pQVar1 = *(QString **)(in_RDI + 0x80);
  QCoreApplication::translate(local_c8,"QPrintSettingsOutput","Current Page",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x17959d);
  pQVar1 = *(QString **)(in_RDI + 0x88);
  QCoreApplication::translate(local_e0,"QPrintSettingsOutput","Selection",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x17960a);
  pQVar1 = *(QString **)(in_RDI + 0x98);
  QCoreApplication::translate(local_f8,"QPrintSettingsOutput","Page Set:",0);
  QLabel::setText(pQVar1);
  QString::~QString((QString *)0x179677);
  pQVar1 = *(QString **)(in_RDI + 0xb0);
  QCoreApplication::translate(local_110,"QPrintSettingsOutput","Output Settings",0);
  QGroupBox::setTitle(pQVar1);
  QString::~QString((QString *)0x1796e4);
  pQVar1 = *(QString **)(in_RDI + 0xc0);
  QCoreApplication::translate(local_128,"QPrintSettingsOutput","Copies:",0);
  QLabel::setText(pQVar1);
  QString::~QString((QString *)0x179751);
  pQVar1 = *(QString **)(in_RDI + 0xd8);
  QCoreApplication::translate(local_140,"QPrintSettingsOutput","Collate",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x1797be);
  pQVar1 = *(QString **)(in_RDI + 0xe8);
  QCoreApplication::translate(local_158,"QPrintSettingsOutput","Reverse",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x17982b);
  pQVar2 = *(QWidget **)(in_RDI + 8);
  uVar3 = QTabWidget::indexOf(pQVar2);
  QCoreApplication::translate(local_170,"QPrintSettingsOutput","Copies",0);
  QTabWidget::setTabText((int)pQVar2,(QString *)(ulong)uVar3);
  QString::~QString((QString *)0x1798ac);
  pQVar1 = *(QString **)(in_RDI + 0x108);
  QCoreApplication::translate(local_188,"QPrintSettingsOutput","Color Mode",0);
  QGroupBox::setTitle(pQVar1);
  QString::~QString((QString *)0x179919);
  pQVar1 = *(QString **)(in_RDI + 0x120);
  QCoreApplication::translate(local_1a0,"QPrintSettingsOutput","Color",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x179986);
  pQVar1 = *(QString **)(in_RDI + 0x130);
  QCoreApplication::translate(local_1b8,"QPrintSettingsOutput","Grayscale",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x1799f3);
  pQVar1 = *(QString **)(in_RDI + 0x138);
  QCoreApplication::translate(local_1d0,"QPrintSettingsOutput","Double Sided Printing",0);
  QGroupBox::setTitle(pQVar1);
  QString::~QString((QString *)0x179a60);
  pQVar1 = *(QString **)(in_RDI + 0x148);
  QCoreApplication::translate(local_1e8,"QPrintSettingsOutput","Off",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x179acd);
  pQVar1 = *(QString **)(in_RDI + 0x150);
  QCoreApplication::translate(local_200,"QPrintSettingsOutput","Long side binding",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x179b3a);
  pQVar1 = *(QString **)(in_RDI + 0x158);
  QCoreApplication::translate(local_218,"QPrintSettingsOutput","Short side binding",0);
  QAbstractButton::setText(pQVar1);
  QString::~QString((QString *)0x179ba7);
  pQVar2 = *(QWidget **)(in_RDI + 8);
  uVar3 = QTabWidget::indexOf(pQVar2);
  QCoreApplication::translate(local_230,"QPrintSettingsOutput","Options",0);
  QTabWidget::setTabText((int)pQVar2,(QString *)(ulong)uVar3);
  QString::~QString((QString *)0x179c2b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void retranslateUi(QWidget *QPrintSettingsOutput)
    {
        QPrintSettingsOutput->setWindowTitle(QCoreApplication::translate("QPrintSettingsOutput", "Form", nullptr));
        gbPrintRange->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Print range", nullptr));
        printAll->setText(QCoreApplication::translate("QPrintSettingsOutput", "Print all", nullptr));
        printRange->setText(QCoreApplication::translate("QPrintSettingsOutput", "Pages from", nullptr));
        label_3->setText(QCoreApplication::translate("QPrintSettingsOutput", "to", nullptr));
        pagesRadioButton->setText(QCoreApplication::translate("QPrintSettingsOutput", "Pages", nullptr));
#if QT_CONFIG(tooltip)
        pagesLineEdit->setToolTip(QCoreApplication::translate("QPrintSettingsOutput", "Specify pages or ranges separated by commas. Ranges are specified by two numbers separated by a hyphen. E.g: 3,5-7,9 prints pages 3, 5, 6, 7 and 9.", nullptr));
#endif // QT_CONFIG(tooltip)
        printCurrentPage->setText(QCoreApplication::translate("QPrintSettingsOutput", "Current Page", nullptr));
        printSelection->setText(QCoreApplication::translate("QPrintSettingsOutput", "Selection", nullptr));
        pageSetLabel->setText(QCoreApplication::translate("QPrintSettingsOutput", "Page Set:", nullptr));
        groupBox->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Output Settings", nullptr));
        label->setText(QCoreApplication::translate("QPrintSettingsOutput", "Copies:", nullptr));
        collate->setText(QCoreApplication::translate("QPrintSettingsOutput", "Collate", nullptr));
        reverse->setText(QCoreApplication::translate("QPrintSettingsOutput", "Reverse", nullptr));
        tabs->setTabText(tabs->indexOf(copiesTab), QCoreApplication::translate("QPrintSettingsOutput", "Copies", nullptr));
        colorMode->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Color Mode", nullptr));
        color->setText(QCoreApplication::translate("QPrintSettingsOutput", "Color", nullptr));
        grayscale->setText(QCoreApplication::translate("QPrintSettingsOutput", "Grayscale", nullptr));
        duplex->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Double Sided Printing", nullptr));
        noDuplex->setText(QCoreApplication::translate("QPrintSettingsOutput", "Off", nullptr));
        duplexLong->setText(QCoreApplication::translate("QPrintSettingsOutput", "Long side binding", nullptr));
        duplexShort->setText(QCoreApplication::translate("QPrintSettingsOutput", "Short side binding", nullptr));
        tabs->setTabText(tabs->indexOf(optionsTab), QCoreApplication::translate("QPrintSettingsOutput", "Options", nullptr));
    }